

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O3

void Abc_TruthWriteHex(FILE *pFile,word *pTruth,int nVars)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  if (nVars + -2 != 0x1f) {
    uVar2 = 1 << ((byte)(nVars + -2) & 0x1f);
    if ((int)uVar2 < 2) {
      uVar2 = 1;
    }
    bVar3 = 0;
    uVar4 = 0;
    do {
      uVar1 = (uint)(pTruth[uVar4 >> 4] >> (bVar3 & 0x3c)) & 0xf;
      if (uVar1 < 10) {
        fprintf((FILE *)pFile,"%d");
      }
      else {
        fputc(uVar1 + 0x37,(FILE *)pFile);
      }
      uVar4 = uVar4 + 1;
      bVar3 = bVar3 + 4;
    } while (uVar2 != uVar4);
  }
  return;
}

Assistant:

void Abc_TruthWriteHex( FILE * pFile, word * pTruth, int nVars )
{
    int nDigits, Digit, k;
    nDigits = (1 << (nVars-2));
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TruthGetHex( pTruth, k );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TruthWriteHexDigit( pFile, Digit );
    }
}